

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::NetStateRule::SerializeWithCachedSizes(NetStateRule *this,CodedOutputStream *output)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Type *pTVar5;
  UnknownFieldSet *unknown_fields;
  int iVar6;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->phase_,output);
  }
  if ((uVar2 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(2,this->min_level_,output);
  }
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(3,this->max_level_,output);
  }
  iVar3 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = 0;
  if (iVar3 < 1) {
    iVar3 = iVar6;
  }
  pRVar1 = &this->stage_;
  for (; iVar3 != iVar6; iVar6 = iVar6 + 1) {
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar1->super_RepeatedPtrFieldBase,iVar6);
    pcVar4 = (pTVar5->_M_dataplus)._M_p;
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar1->super_RepeatedPtrFieldBase,iVar6);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,(int)pTVar5->_M_string_length,SERIALIZE,"caffe.NetStateRule.stage");
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar1->super_RepeatedPtrFieldBase,iVar6);
    google::protobuf::internal::WireFormatLite::WriteString(4,pTVar5,output);
  }
  iVar3 = (this->not_stage_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = 0;
  if (iVar3 < 1) {
    iVar3 = iVar6;
  }
  pRVar1 = &this->not_stage_;
  for (; iVar3 != iVar6; iVar6 = iVar6 + 1) {
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar1->super_RepeatedPtrFieldBase,iVar6);
    pcVar4 = (pTVar5->_M_dataplus)._M_p;
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar1->super_RepeatedPtrFieldBase,iVar6);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar4,(int)pTVar5->_M_string_length,SERIALIZE,"caffe.NetStateRule.not_stage");
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar1->super_RepeatedPtrFieldBase,iVar6);
    google::protobuf::internal::WireFormatLite::WriteString(5,pTVar5,output);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  unknown_fields = NetStateRule::unknown_fields(this);
  google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  return;
}

Assistant:

void NetStateRule::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.NetStateRule)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.Phase phase = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->phase(), output);
  }

  // optional int32 min_level = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->min_level(), output);
  }

  // optional int32 max_level = 3;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->max_level(), output);
  }

  // repeated string stage = 4;
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->stage(i).data(), this->stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetStateRule.stage");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      4, this->stage(i), output);
  }

  // repeated string not_stage = 5;
  for (int i = 0, n = this->not_stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->not_stage(i).data(), this->not_stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetStateRule.not_stage");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      5, this->not_stage(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.NetStateRule)
}